

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

double __thiscall
baryonyx::itm::default_cost_type<double>::min(default_cost_type<double> *this,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar7._8_8_ = 0x7fffffffffffffff;
  auVar7._0_8_ = 0x7fffffffffffffff;
  uVar5 = 0;
  auVar4 = ZEXT816(0x7fefffffffffffff);
  while ((uint)n != uVar5) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->linear_elements)._M_t.
                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl[uVar5];
    uVar5 = uVar5 + 1;
    auVar6 = vandpd_avx(auVar8,auVar7);
    uVar1 = vcmppd_avx512vl(auVar8,ZEXT816(0) << 0x40,4);
    uVar2 = vcmppd_avx512vl(auVar6,auVar4,1);
    bVar3 = (byte)uVar1 & 3 & (byte)uVar2 & 3;
    auVar6._0_8_ = (ulong)(bVar3 & 1) * auVar6._0_8_ +
                   (ulong)!(bool)(bVar3 & 1) * (long)auVar4._0_8_;
    auVar6._8_8_ = auVar4._8_8_;
    auVar4 = auVar6;
  }
  return auVar4._0_8_;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        return min;
    }